

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O2

void test_condition_timing_out(void)

{
  atomic<bool> should_have_timed_out;
  thread thread;
  long *local_c8;
  pthread_mutex_t lock;
  LockstepScheduler ls;
  pthread_cond_t cond;
  
  pthread_cond_init((pthread_cond_t *)&cond,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&lock,(pthread_mutexattr_t *)0x0);
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x20] = '\0';
  ls._65_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__size[0x18] = '\0';
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._25_7_ = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex.__align = 0;
  ls.timed_waits_mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ls.time_us_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ls.timed_waits_.
  super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  LockstepScheduler::set_absolute_time(&ls,0xbc614e);
  should_have_timed_out._M_base._M_i = (__atomic_base<bool>)false;
  pthread_mutex_lock((pthread_mutex_t *)&lock);
  thread._M_id._M_thread = (id)0;
  local_c8 = (long *)operator_new(0x28);
  *local_c8 = (long)&PTR___State_0010cc60;
  local_c8[1] = (long)&ls;
  local_c8[2] = (long)&cond;
  local_c8[3] = (long)&lock;
  local_c8[4] = (long)&should_have_timed_out;
  std::thread::_M_start_thread(&thread,&local_c8,0);
  if (local_c8 != (long *)0x0) {
    (**(code **)(*local_c8 + 8))();
  }
  LockstepScheduler::set_absolute_time(&ls,0xbc6342);
  LOCK();
  should_have_timed_out._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  LockstepScheduler::set_absolute_time(&ls,0xbc672a);
  std::thread::join();
  pthread_mutex_destroy((pthread_mutex_t *)&lock);
  pthread_cond_destroy((pthread_cond_t *)&cond);
  std::thread::~thread(&thread);
  std::
  vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
  ::~vector(&ls.timed_waits_);
  return;
}

Assistant:

void test_condition_timing_out()
{
    // Create locked condition.
    pthread_cond_t cond;
    pthread_cond_init(&cond, NULL);

    // And a lock which needs to be locked
    pthread_mutex_t lock;
    pthread_mutex_init(&lock, NULL);

    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    std::atomic<bool> should_have_timed_out{false};
    pthread_mutex_lock(&lock);

    // Use a thread to wait for condition while we already have the lock.
    // This ensures the synchronization happens in the right order.
    std::thread thread([&ls, &cond, &lock, &should_have_timed_out]() {
        assert(ls.cond_timedwait(&cond, &lock, some_time_us + 1000) == -1);
        assert(errno == ETIMEDOUT);
        assert(should_have_timed_out);
        // It should be re-locked afterwards, so we should be able to unlock it.
        assert(pthread_mutex_unlock(&lock) == 0);
    });

    ls.set_absolute_time(some_time_us + 500);
    should_have_timed_out = true;
    ls.set_absolute_time(some_time_us + 1500);

    thread.join();

    pthread_mutex_destroy(&lock);
    pthread_cond_destroy(&cond);

}